

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O2

void thread_pool::ThreadPool::Task(ThreadPool *thread_pool)

{
  _Elt_pointer pfVar1;
  _Manager_type p_Var2;
  type task;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  
  while( true ) {
    Semaphore::Wait(&thread_pool->thread_semaphore_);
    if (((thread_pool->terminate_)._M_base._M_i & 1U) != 0) {
      return;
    }
    Semaphore::Wait(&thread_pool->queue_semaphore_);
    pfVar1 = (thread_pool->queue_).c.
             super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_38 = (_Manager_type)0x0;
    local_30 = pfVar1->_M_invoker;
    p_Var2 = (pfVar1->super__Function_base)._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      local_48._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(pfVar1->super__Function_base)._M_functor;
      local_48._8_8_ = *(undefined8 *)((long)&(pfVar1->super__Function_base)._M_functor + 8);
      (pfVar1->super__Function_base)._M_manager = (_Manager_type)0x0;
      pfVar1->_M_invoker = (_Invoker_type)0x0;
      local_38 = p_Var2;
    }
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
              (&(thread_pool->queue_).c);
    Semaphore::Signal(&thread_pool->queue_semaphore_);
    if (((thread_pool->terminate_)._M_base._M_i & 1U) != 0) break;
    std::function<void_()>::operator()((function<void_()> *)&local_48);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

static void Task(ThreadPool* thread_pool) {
    while (true) {
      thread_pool->thread_semaphore_.Wait();

      if (thread_pool->terminate_) {
        break;
      }

      thread_pool->queue_semaphore_.Wait();
      auto task = std::move(thread_pool->queue_.front());
      thread_pool->queue_.pop();
      thread_pool->queue_semaphore_.Signal();

      if (thread_pool->terminate_) {
        break;
      }

      task();
    }
  }